

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semicircle.hpp
# Opt level: O3

bool __thiscall
boost::geometry::model::
semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>::
intersects_point<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
          (semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
           *this,point<double,_2UL,_boost::geometry::cs::cartesian> *p)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double c2_1;
  double dVar5;
  double c2;
  double dVar6;
  eps_policy<boost::geometry::math::detail::equals_factor_policy<double,_true>_> epsp;
  equals_factor_policy<double,_true> local_18;
  
  local_18.factor = 1.0;
  dVar1 = strategy::side::side_by_triangle<void>::compute_side_value<double,double,false>::
          apply<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::strategy::side::side_by_triangle<void>::eps_policy<boost::geometry::math::detail::equals_factor_policy<double,true>>>
                    ((point<double,_2UL,_boost::geometry::cs::cartesian> *)this,
                     (point<double,_2UL,_boost::geometry::cs::cartesian> *)(this + 0x10),p,
                     (eps_policy<boost::geometry::math::detail::equals_factor_policy<double,_true>_>
                      *)&local_18);
  if (((dVar1 == 0.0) && (!NAN(dVar1))) ||
     (((ulong)ABS(dVar1) < 0x7ff0000000000000 &&
      (ABS(dVar1) <= local_18.factor * 2.220446049250313e-16)))) {
    iVar3 = 0;
  }
  else {
    iVar3 = (uint)(0.0 < dVar1) * 2 + -1;
  }
  if (iVar3 == *(short *)(this + 0x20)) {
    dVar6 = (*(double *)(this + 8) + *(double *)(this + 0x18)) * 0.5 - p->m_values[1];
    dVar5 = (*(double *)this + *(double *)(this + 0x10)) * 0.5 - p->m_values[0];
    dVar4 = *(double *)(this + 8) - *(double *)(this + 0x18);
    dVar1 = *(double *)this - *(double *)(this + 0x10);
    bVar2 = SQRT(dVar6 * dVar6 + dVar5 * dVar5 + 0.0) <=
            SQRT(dVar4 * dVar4 + dVar1 * dVar1 + 0.0) * 0.5;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool intersects_point(OtherPoint const &p) const
    {
        return strategy::side::side_by_triangle<>::apply(s.first, s.second, p) == side
        && geometry::distance(return_centroid<Point>(s), p) <= geometry::length(s) / 2;
    }